

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

void convsamp(JSAMPARRAY sample_data,JDIMENSION start_col,DCTELEM *workspace)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  DCTELEM *workspaceptr;
  
  uVar2 = (ulong)start_col;
  lVar3 = 0;
  do {
    lVar1 = *(long *)((long)sample_data + lVar3);
    workspace[lVar3] = *(byte *)(lVar1 + uVar2) - 0x80;
    workspace[lVar3 + 1] = *(byte *)(lVar1 + 1 + uVar2) - 0x80;
    workspace[lVar3 + 2] = *(byte *)(lVar1 + 2 + uVar2) - 0x80;
    workspace[lVar3 + 3] = *(byte *)(lVar1 + 3 + uVar2) - 0x80;
    workspace[lVar3 + 4] = *(byte *)(lVar1 + 4 + uVar2) - 0x80;
    workspace[lVar3 + 5] = *(byte *)(lVar1 + 5 + uVar2) - 0x80;
    workspace[lVar3 + 6] = *(byte *)(lVar1 + 6 + uVar2) - 0x80;
    workspace[lVar3 + 7] = *(byte *)(lVar1 + 7 + uVar2) - 0x80;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

METHODDEF(void)
convsamp(JSAMPARRAY sample_data, JDIMENSION start_col, DCTELEM *workspace)
{
  register DCTELEM *workspaceptr;
  register JSAMPROW elemptr;
  register int elemr;

  workspaceptr = workspace;
  for (elemr = 0; elemr < DCTSIZE; elemr++) {
    elemptr = sample_data[elemr] + start_col;

#if DCTSIZE == 8                /* unroll the inner loop */
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
#else
    {
      register int elemc;
      for (elemc = DCTSIZE; elemc > 0; elemc--)
        *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    }
#endif
  }
}